

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL3_glfw::GLEngine::setDepthMode(GLEngine *this,DepthMode newMode)

{
  undefined4 in_ESI;
  
  switch(in_ESI) {
  case 0:
    (*glad_glEnable)(0xb71);
    (*glad_glDepthFunc)(0x201);
    (*glad_glDepthMask)('\x01');
    break;
  case 1:
    (*glad_glEnable)(0xb71);
    (*glad_glDepthFunc)(0x203);
    (*glad_glDepthMask)('\x01');
    break;
  case 2:
    (*glad_glEnable)(0xb71);
    (*glad_glDepthFunc)(0x203);
    (*glad_glDepthMask)('\0');
    break;
  case 3:
    (*glad_glEnable)(0xb71);
    (*glad_glDepthFunc)(0x204);
    (*glad_glDepthMask)('\x01');
    break;
  case 4:
    (*glad_glDisable)(0xb71);
    (*glad_glDepthMask)('\0');
  }
  return;
}

Assistant:

void GLEngine::setDepthMode(DepthMode newMode) {
  switch (newMode) {
  case DepthMode::Less:
    glEnable(GL_DEPTH_TEST);
    glDepthFunc(GL_LESS);
    glDepthMask(GL_TRUE);
    break;
  case DepthMode::LEqual:
    glEnable(GL_DEPTH_TEST);
    glDepthFunc(GL_LEQUAL);
    glDepthMask(GL_TRUE);
    break;
  case DepthMode::LEqualReadOnly:
    glEnable(GL_DEPTH_TEST);
    glDepthFunc(GL_LEQUAL);
    glDepthMask(GL_FALSE);
    break;
  case DepthMode::Greater:
    glEnable(GL_DEPTH_TEST);
    glDepthFunc(GL_GREATER);
    glDepthMask(GL_TRUE);
    break;
  case DepthMode::Disable:
    glDisable(GL_DEPTH_TEST);
    glDepthMask(GL_FALSE); // doesn't actually matter
    break;
  }
}